

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O0

void __thiscall QWidgetPrivate::setSharedPainter(QWidgetPrivate *this,QPainter *painter)

{
  QTLWExtra *pQVar1;
  QWidget *in_RSI;
  QWidgetPrivate *in_RDI;
  QTLWExtra *x;
  QWidget *q;
  QWidgetPrivate *in_stack_ffffffffffffffe0;
  
  q_func(in_RDI);
  QWidget::window(in_RSI);
  QWidget::d_func((QWidget *)0x3888e3);
  pQVar1 = topData(in_stack_ffffffffffffffe0);
  pQVar1->sharedPainter = (QPainter *)in_RSI;
  return;
}

Assistant:

inline void QWidgetPrivate::setSharedPainter(QPainter *painter)
{
    Q_Q(QWidget);
    QTLWExtra *x = q->window()->d_func()->topData();
    x->sharedPainter = painter;
}